

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DbCheckPostLower.cpp
# Opt level: O3

bool __thiscall
DbCheckPostLower::IsCallToHelper(DbCheckPostLower *this,Instr *instr,JnHelperMethod method)

{
  Opnd *this_00;
  code *pcVar1;
  OpndKind OVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  if (instr->m_opcode == CALL) {
    this_00 = instr->m_prev->m_src1;
    if (this_00 == (Opnd *)0x0) {
      return false;
    }
    if (instr->m_prev->m_opcode != MOV) {
      return false;
    }
    OVar2 = IR::Opnd::GetKind(this_00);
    if (OVar2 == OpndKindHelperCall) {
      OVar2 = IR::Opnd::GetKind(this_00);
      if (OVar2 != OpndKindHelperCall) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar4 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x16a,"(this->IsHelperCallOpnd())","Bad call to AsHelperCallOpnd()");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
      return *(JnHelperMethod *)&this_00[1]._vptr_Opnd == method;
    }
  }
  return false;
}

Assistant:

bool
DbCheckPostLower::IsCallToHelper(IR::Instr *instr, IR::JnHelperMethod method)
{
    IR::Instr *prev = instr->m_prev;
    IR::Opnd *src1 = prev->GetSrc1();
    return instr->m_opcode == Js::OpCode::CALL &&
        prev->m_opcode == Js::OpCode::MOV &&
        src1 &&
        src1->IsHelperCallOpnd() &&
        src1->AsHelperCallOpnd()->m_fnHelper == method;
}